

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O1

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::validateSignalEventOwnership
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hSignalEvent)

{
  __node_base_ptr p_Var1;
  ostream *poVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __hash_code __code;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  string previousActionOwner;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  uVar5 = (this->eventToDagID)._M_h._M_bucket_count;
  uVar4 = (ulong)hSignalEvent % uVar5;
  p_Var6 = (this->eventToDagID)._M_h._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     (ze_event_handle_t)p_Var6->_M_nxt[1]._M_nxt != hSignalEvent)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar5 != uVar4) ||
         (p_Var7 = p_Var6, (ze_event_handle_t)p_Var3[1]._M_nxt == hSignalEvent)) goto LAB_001ae9c7;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001ae9c7:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if ((p_Var3 != (_Hash_node_base *)0x0) &&
     (uVar5 = (ulong)*(uint *)&p_Var3[2]._M_nxt, uVar5 != 0xffffffff)) {
    p_Var8 = (_Hash_node_base *)0x0;
    p_Var1 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->dagIDToAction)._M_h,
                        uVar5 % (this->dagIDToAction)._M_h._M_bucket_count,
                        (key_type_conflict *)(p_Var3 + 2),uVar5);
    if (p_Var1 != (__node_base_ptr)0x0) {
      p_Var8 = p_Var1->_M_nxt;
    }
    if (p_Var8 != (_Hash_node_base *)0x0) {
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,p_Var8[2]._M_nxt,
                 (long)&(p_Var8[2]._M_nxt)->_M_nxt + (long)&(p_Var8[3]._M_nxt)->_M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Warning: ",9);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(zeCallDisc->_M_dataplus)._M_p,
                          zeCallDisc->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," is using the same ze_event_handle_t for signal {",0x31);
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"} which has been previously used by: ",0x25);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,local_38);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::validateSignalEventOwnership(const std::string &zeCallDisc,
                                                                  const ze_event_handle_t hSignalEvent) {
    const auto it = eventToDagID.find(hSignalEvent);
    if (it != eventToDagID.end() && it->second != invalidDagID) {
        const auto actionIt = dagIDToAction.find(it->second);
        if (actionIt != dagIDToAction.end()) {
            const std::string previousActionOwner = actionIt->second.first;
            std::cerr << "Warning: " << zeCallDisc << " is using the same ze_event_handle_t for signal {" << hSignalEvent << "} which has been previously used by: " << previousActionOwner << std::endl;
        }
    }
}